

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_tests.cpp
# Opt level: O0

void __thiscall SetUpSkipTest::SetUp(SetUpSkipTest *this)

{
  bool bVar1;
  Fixed *fixed;
  char *message;
  AssertionHelper local_1d8;
  Fixed local_198;
  SetUpSkipTest *local_10;
  SetUpSkipTest *this_local;
  
  local_10 = this;
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    memset(&local_198,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_198);
    fixed = iutest::AssertionHelper::Fixed::operator<<(&local_198,(char (*) [14])"skip in SetUp");
    bVar1 = iutest::UnitTestImpl::SkipTest();
    message = "Skipped. but already failed. ";
    if (bVar1) {
      message = "Skipped. ";
    }
    iutest::AssertionHelper::AssertionHelper
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/skip_tests.cpp"
               ,0x44,message,kSkip);
    iutest::AssertionHelper::operator=(&local_1d8,fixed);
    iutest::AssertionHelper::~AssertionHelper(&local_1d8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_198);
  }
  return;
}

Assistant:

IUTEST_CXX_OVERRIDE IUTEST_CXX_FINAL
    {
        IUTEST_SKIP() << "skip in SetUp";
    }